

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
::initEmpty(DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
            *this)

{
  uint uVar1;
  uint uVar2;
  unsigned_long uVar3;
  DenseSetPair<unsigned_long> *pDVar4;
  unsigned_long *puVar5;
  DenseSetPair<unsigned_long> *E;
  DenseSetPair<unsigned_long> *B;
  unsigned_long EmptyKey;
  DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
  *this_local;
  
  setNumEntries(this,0);
  setNumTombstones(this,0);
  uVar1 = getNumBuckets(this);
  uVar2 = getNumBuckets(this);
  if ((uVar1 & uVar2 - 1) != 0) {
    __assert_fail("(getNumBuckets() & (getNumBuckets()-1)) == 0 && \"# initial buckets must be a power of two!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                  ,0x15c,
                  "void llvm::DenseMapBase<llvm::DenseMap<unsigned long, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseSetPair<unsigned long>>, unsigned long, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseSetPair<unsigned long>>::initEmpty() [DerivedT = llvm::DenseMap<unsigned long, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseSetPair<unsigned long>>, KeyT = unsigned long, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseSetPair<unsigned long>]"
                 );
  }
  uVar3 = getEmptyKey();
  E = getBuckets(this);
  pDVar4 = getBucketsEnd(this);
  for (; E != pDVar4; E = E + 1) {
    puVar5 = detail::DenseSetPair<unsigned_long>::getFirst(E);
    *puVar5 = uVar3;
  }
  return;
}

Assistant:

void initEmpty() {
    setNumEntries(0);
    setNumTombstones(0);

    assert((getNumBuckets() & (getNumBuckets()-1)) == 0 &&
           "# initial buckets must be a power of two!");
    const KeyT EmptyKey = getEmptyKey();
    for (BucketT *B = getBuckets(), *E = getBucketsEnd(); B != E; ++B)
      ::new (&B->getFirst()) KeyT(EmptyKey);
  }